

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncLogging.cpp
# Opt level: O2

void __thiscall AsyncLogging::AsyncLogging(AsyncLogging *this,string *logFileName,int flushInterval)

{
  MutexLock *this_00;
  FixedBuffer<4000000> *pFVar1;
  allocator<char> local_a1;
  MutexLock *local_a0;
  Thread *local_98;
  string *local_90;
  string local_88;
  ThreadFunc local_68;
  _Bind<void_(AsyncLogging::*(AsyncLogging_*))()> local_48;
  
  this->flushInterval_ = flushInterval;
  this->running_ = false;
  std::__cxx11::string::string((string *)&this->basename_,logFileName);
  local_48._M_f = (offset_in_AsyncLogging_to_subr)threadFunc;
  local_48._8_8_ = 0;
  local_90 = &this->basename_;
  local_48._M_bound_args.super__Tuple_impl<0UL,_AsyncLogging_*>.
  super__Head_base<0UL,_AsyncLogging_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_AsyncLogging_*>)(_Tuple_impl<0UL,_AsyncLogging_*>)this;
  std::function<void()>::function<std::_Bind<void(AsyncLogging::*(AsyncLogging*))()>,void>
            ((function<void()> *)&local_68,&local_48);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"Logging",&local_a1);
  Thread::Thread(&this->thread_,&local_68,&local_88);
  local_98 = &this->thread_;
  std::__cxx11::string::~string((string *)&local_88);
  std::_Function_base::~_Function_base(&local_68.super__Function_base);
  this_00 = &this->mutex_;
  MutexLock::MutexLock(this_00);
  local_a0 = this_00;
  Condition::Condition(&this->cond_,this_00);
  pFVar1 = (FixedBuffer<4000000> *)operator_new(0x3d0908);
  pFVar1->cur_ = (char *)pFVar1;
  std::__shared_ptr<FixedBuffer<4000000>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<FixedBuffer<4000000>,void>
            ((__shared_ptr<FixedBuffer<4000000>,(__gnu_cxx::_Lock_policy)2> *)&this->currentBuffer_,
             pFVar1);
  pFVar1 = (FixedBuffer<4000000> *)operator_new(0x3d0908);
  pFVar1->cur_ = (char *)pFVar1;
  std::__shared_ptr<FixedBuffer<4000000>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<FixedBuffer<4000000>,void>
            ((__shared_ptr<FixedBuffer<4000000>,(__gnu_cxx::_Lock_policy)2> *)&this->nextBuffer_,
             pFVar1);
  (this->buffers_).
  super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->buffers_).
  super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->buffers_).
  super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CountDownLatch::CountDownLatch(&this->latch_,1);
  if (1 < logFileName->_M_string_length) {
    memset((this->currentBuffer_).
           super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0,4000000);
    memset((this->nextBuffer_).super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr,0,4000000);
    std::
    vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
    ::reserve(&this->buffers_,0x10);
    return;
  }
  __assert_fail("logFileName.size() > 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ruanyvan[P]WebServer/WebServer/base/AsyncLogging.cpp"
                ,0x18,"AsyncLogging::AsyncLogging(std::string, int)");
}

Assistant:

AsyncLogging::AsyncLogging(std::string logFileName, int flushInterval)
        : flushInterval_(flushInterval),
        running_(false),
        basename_(logFileName),
        thread_(std::bind(&AsyncLogging::threadFunc, this), "Logging"),
        mutex_(),
        cond_(mutex_),
        currentBuffer_(new Buffer),
        nextBuffer_(new Buffer),
        buffers_(),
        latch_(1){
            assert(logFileName.size() > 1);
            currentBuffer_->bzero();
            nextBuffer_->bzero();
            buffers_.reserve(16);
}